

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O2

string * __thiscall
glcts::generateBasicVertexSrc_abi_cxx11_
          (string *__return_storage_ptr__,glcts *this,GLSLVersion glslVersion)

{
  char *pcVar1;
  ostream *poVar2;
  stringstream str;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  pcVar1 = glu::getGLSLVersionDeclaration((GLSLVersion)this);
  poVar2 = std::operator<<(&local_190,pcVar1);
  std::operator<<(poVar2,"\n");
  std::operator<<(&local_190,"in highp vec4 a_position;\n");
  if (8 < (int)(GLSLVersion)this) {
    std::operator<<(&local_190,"out gl_PerVertex {\n  vec4 gl_Position;\n};\n");
  }
  std::operator<<(&local_190,"void main (void)\n{\n   gl_Position = a_position;\n}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static std::string generateBasicVertexSrc(glu::GLSLVersion glslVersion)
{
	std::stringstream str;

	str << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
	str << "in highp vec4 a_position;\n";
	if (glslVersion >= glu::GLSL_VERSION_410)
	{
		str << "out gl_PerVertex {\n"
			   "  vec4 gl_Position;\n"
			   "};\n";
	}
	str << "void main (void)\n"
		   "{\n"
		   "   gl_Position = a_position;\n"
		   "}\n";

	return str.str();
}